

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

int __thiscall
fmt::v5::vfprintf<char[3],char>
          (v5 *this,FILE *f,char (*format) [3],
          basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
          args)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  basic_string_view<char> format_00;
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_001d5f50;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  format_00 = to_string_view<char>((char *)f);
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
          )args.types_;
  args_00.types_ = (unsigned_long_long)format;
  internal::
  printf<char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
            (&buffer.super_basic_buffer<char>,format_00,args_00);
  sVar2 = buffer.super_basic_buffer<char>.size_;
  sVar3 = fwrite(buffer.super_basic_buffer<char>.ptr_,1,buffer.super_basic_buffer<char>.size_,
                 (FILE *)this);
  sVar1 = 0xffffffffffffffff;
  if (sVar2 <= sVar3) {
    sVar1 = sVar2;
  }
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  return (int)sVar1;
}

Assistant:

inline int vfprintf(std::FILE *f, const S &format,
                    basic_format_args<typename basic_printf_context_t<
                      internal::basic_buffer<Char>>::type> args) {
  basic_memory_buffer<Char> buffer;
  printf(buffer, to_string_view(format), args);
  std::size_t size = buffer.size();
  return std::fwrite(
    buffer.data(), sizeof(Char), size, f) < size ? -1 : static_cast<int>(size);
}